

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RVOSimulator.cpp
# Opt level: O3

void __thiscall
RVO::RVOSimulator::RVOSimulator
          (RVOSimulator *this,float timeStep,float neighborDist,size_t maxNeighbors,
          float timeHorizon,float timeHorizonObst,float radius,float maxSpeed,Vector2 *velocity)

{
  KdTree *this_00;
  Agent *this_01;
  
  (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->defaultAgent_ = (Agent *)0x0;
  (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->globalTime_ = 0.0;
  this->kdTree_ = (KdTree *)0x0;
  (this->obstacles_).super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->obstacles_).super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->obstacles_).super__Vector_base<RVO::Obstacle_*,_std::allocator<RVO::Obstacle_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->timeStep_ = timeStep;
  this_00 = (KdTree *)operator_new(0x40);
  KdTree::KdTree(this_00,this);
  this->kdTree_ = this_00;
  this_01 = (Agent *)operator_new(0x98);
  Agent::Agent(this_01,this);
  this->defaultAgent_ = this_01;
  this_01->maxNeighbors_ = maxNeighbors;
  this_01->maxSpeed_ = maxSpeed;
  this_01->neighborDist_ = neighborDist;
  this_01->radius_ = radius;
  this_01->timeHorizon_ = timeHorizon;
  this_01->timeHorizonObst_ = timeHorizonObst;
  this_01->velocity_ = *velocity;
  return;
}

Assistant:

RVOSimulator::RVOSimulator(float timeStep, float neighborDist, size_t maxNeighbors, float timeHorizon, float timeHorizonObst, float radius, float maxSpeed, const Vector2 &velocity) : defaultAgent_(NULL), globalTime_(0.0f), kdTree_(NULL), timeStep_(timeStep)
	{
		kdTree_ = new KdTree(this);
		defaultAgent_ = new Agent(this);

		defaultAgent_->maxNeighbors_ = maxNeighbors;
		defaultAgent_->maxSpeed_ = maxSpeed;
		defaultAgent_->neighborDist_ = neighborDist;
		defaultAgent_->radius_ = radius;
		defaultAgent_->timeHorizon_ = timeHorizon;
		defaultAgent_->timeHorizonObst_ = timeHorizonObst;
		defaultAgent_->velocity_ = velocity;
	}